

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O0

Vec_Int_t * Sle_ManComputeCuts(Gia_Man_t *p,int nLutSize,int fVerbose)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  double dVar8;
  Vec_Int_t *vCuts;
  Vec_Int_t *vTemp;
  int local_20;
  int nCuts;
  int iObj;
  int i;
  int fVerbose_local;
  int nLutSize_local;
  Gia_Man_t *p_local;
  
  vTemp._4_4_ = 0;
  p_00 = Vec_IntAlloc(1000);
  iVar1 = Gia_ManAndNum(p);
  p_01 = Vec_IntAlloc(iVar1 * 0x1e);
  if (6 < nLutSize) {
    __assert_fail("nLutSize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLE.c"
                  ,0xd2,"Vec_Int_t *Sle_ManComputeCuts(Gia_Man_t *, int, int)");
  }
  iVar1 = Gia_ManObjNum(p);
  Vec_IntFill(p_01,iVar1,0);
  nCuts = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar7 = false;
    if (nCuts < iVar1) {
      pGVar6 = Gia_ManCi(p,nCuts);
      local_20 = Gia_ObjId(p,pGVar6);
      bVar7 = local_20 != 0;
    }
    if (!bVar7) break;
    iVar1 = Vec_IntSize(p_01);
    Vec_IntWriteEntry(p_01,local_20,iVar1);
    Vec_IntPush(p_01,0);
    iVar1 = Sle_CutSetSizeSign(1,1 << ((byte)((long)local_20 % 0x1c) & 0x1f));
    Vec_IntPush(p_01,iVar1);
    Vec_IntPush(p_01,local_20);
    nCuts = nCuts + 1;
  }
  for (local_20 = 0; local_20 < p->nObjs; local_20 = local_20 + 1) {
    pGVar6 = Gia_ManObj(p,local_20);
    iVar1 = Gia_ObjIsAnd(pGVar6);
    if (iVar1 != 0) {
      iVar1 = Sle_ManCutMerge(p,local_20,p_01,p_00,nLutSize);
      vTemp._4_4_ = iVar1 + vTemp._4_4_;
    }
  }
  if (fVerbose != 0) {
    uVar2 = Gia_ManAndNum(p);
    iVar1 = Gia_ManAndNum(p);
    iVar3 = Vec_IntSize(p_01);
    iVar4 = Gia_ManObjNum(p);
    iVar5 = Gia_ManAndNum(p);
    dVar8 = Vec_IntMemory(p_01);
    printf("Nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.  Mem = %.2f MB.\n",
           ((double)(int)vTemp._4_4_ * 1.0) / (double)iVar1,
           ((double)(iVar3 - iVar4) * 1.0) / (double)iVar5,(dVar8 * 1.0) / 1048576.0,(ulong)uVar2,
           (ulong)vTemp._4_4_);
  }
  Vec_IntFree(p_00);
  return p_01;
}

Assistant:

Vec_Int_t * Sle_ManComputeCuts( Gia_Man_t * p, int nLutSize, int fVerbose )
{
    int i, iObj, nCuts = 0;
    Vec_Int_t * vTemp = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCuts = Vec_IntAlloc( 30 * Gia_ManAndNum(p) );
    assert( nLutSize <= 6 );
    Vec_IntFill( vCuts, Gia_ManObjNum(p), 0 );
    Gia_ManForEachCiId( p, iObj, i )
    {
        Vec_IntWriteEntry( vCuts, iObj, Vec_IntSize(vCuts) );
        Vec_IntPush( vCuts, 0 );
        Vec_IntPush( vCuts, Sle_CutSetSizeSign(1, 1<<(iObj % 28)) );
        Vec_IntPush( vCuts, iObj );
    }
    Gia_ManForEachAndId( p, iObj )
        nCuts += Sle_ManCutMerge( p, iObj, vCuts, vTemp, nLutSize );
    if ( fVerbose )
        printf( "Nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.  Mem = %.2f MB.\n", 
            Gia_ManAndNum(p), nCuts, 1.0*nCuts/Gia_ManAndNum(p), 
            1.0*(Vec_IntSize(vCuts)-Gia_ManObjNum(p))/Gia_ManAndNum(p), 
            1.0*Vec_IntMemory(vCuts) / (1<<20) );
    Vec_IntFree( vTemp );
    return vCuts;
}